

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O1

void __thiscall
ddd::DaTrie<true,_true,_false>::delete_sib_(DaTrie<true,_true,_false> *this,uint32_t node_pos)

{
  pointer pBVar1;
  pointer pNVar2;
  Bc BVar3;
  undefined8 uVar4;
  uint8_t *puVar5;
  uint8_t *puVar6;
  
  pBVar1 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
           super__Vector_impl_data._M_start;
  pNVar2 = (this->node_links_).super__Vector_base<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>.
           _M_impl.super__Vector_impl_data._M_start;
  BVar3 = pBVar1[node_pos];
  uVar4 = *(undefined8 *)(&pBVar1->field_0x0 + ((ulong)BVar3 >> 0x1d & 0x3fffffff8));
  puVar5 = &pNVar2->child + (uint)(BVar3._4_4_ * 2);
  puVar6 = puVar5;
  do {
    puVar6 = &pNVar2[(uint)*puVar6 ^ (uint)uVar4 & 0x7fffffff].sib;
  } while (*puVar6 != (byte)((byte)uVar4 ^ (byte)node_pos));
  if (*puVar5 == *puVar6) {
    *puVar5 = pNVar2[node_pos].sib;
  }
  *puVar6 = pNVar2[node_pos].sib;
  return;
}

Assistant:

void delete_sib_(uint32_t node_pos) {
    assert(node_pos < bc_.size());
    assert(bc_[node_pos].is_fixed());

    auto parent_pos = bc_[node_pos].check();
    auto base = bc_[parent_pos].base();
    auto label = static_cast<uint8_t>(base ^ node_pos);

    auto _node_pos = base ^node_links_[parent_pos].child;
    while (node_links_[_node_pos].sib != label) {
      _node_pos = base ^ node_links_[_node_pos].sib;
    }

    if (node_links_[parent_pos].child == node_links_[_node_pos].sib) {
      node_links_[parent_pos].child = node_links_[node_pos].sib;
    }
    node_links_[_node_pos].sib = node_links_[node_pos].sib;
  }